

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
          (ShaderImageLoadStoreBase *this,int x,int y,int w,int h,vec4 *expected)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar4;
  undefined4 in_register_0000000c;
  vec4 *epsilon;
  ulong uVar5;
  Vector<float,_4> *v;
  int iVar6;
  vec4 *pvVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> fb;
  string local_78;
  vec4 local_58;
  Vector<float,_4> local_40;
  long lVar3;
  
  iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  auVar10._0_4_ = (float)(int)(float)(*(int *)(lVar3 + 8) * 0x800000 + 0x3f800000);
  auVar10._4_4_ = (float)(int)(float)(*(int *)(lVar3 + 0xc) * 0x800000 + 0x3f800000);
  auVar10._8_4_ = (float)(int)(float)(*(int *)(lVar3 + 0x10) * 0x800000 + 0x3f800000);
  auVar10._12_4_ = (float)(int)(float)(*(int *)(lVar3 + 0x14) * 0x800000 + 0x3f800000);
  local_58.m_data = (float  [4])divps(_DAT_0166f110,auVar10);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&fb,(long)(y * x),(allocator_type *)&local_78);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1908,0x1406,
             fb.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  uVar5 = 0;
  if (0 < x) {
    uVar5 = (ulong)(uint)x;
  }
  iVar1 = 0;
  if (0 < y) {
    iVar1 = y;
  }
  iVar2 = 0;
  epsilon = (vec4 *)0x0;
  do {
    iVar4 = (int)epsilon;
    pvVar7 = epsilon;
    uVar8 = uVar5;
    if (iVar2 == iVar1) {
LAB_00a2e02d:
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&fb.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return y <= iVar2;
    }
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      iVar6 = (int)pvVar7;
      bVar9 = ColorEqual((ShaderImageLoadStoreBase *)
                         (fb.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar6),
                         (vec4 *)CONCAT44(in_register_0000000c,w),&local_58,epsilon);
      pvVar7 = (vec4 *)(ulong)(iVar6 + 1);
      if (!bVar9) {
        tcu::Vector<float,_4>::Vector
                  (&local_40,
                   (Vector<float,_4> *)
                   (fb.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar6));
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                  (&local_78,&local_40,v);
        anon_unknown_0::Output("First bad color: %s.\n",local_78._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_78);
        goto LAB_00a2e02d;
      }
    }
    iVar2 = iVar2 + 1;
    epsilon = (vec4 *)(ulong)(uint)(iVar4 + x);
  } while( true );
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		bool					 status		  = true;
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		std::vector<vec4> fb(w * h);
		glReadPixels(x, y, w, h, GL_RGBA, GL_FLOAT, &fb[0]);

		for (int yy = 0; yy < h; ++yy)
		{
			for (int xx = 0; xx < w; ++xx)
			{
				const int idx = yy * w + xx;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					Output("First bad color: %s.\n", ToString(fb[idx]).c_str());
					status = false;
					return status;
				}
			}
		}
		return status;
	}